

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bitvector_tests.cpp
# Opt level: O0

void bsim::print_float_bits(float f)

{
  float in_stack_0000018c;
  string local_28 [40];
  
  float_bit_string_abi_cxx11_(in_stack_0000018c);
  std::operator<<((ostream *)&std::cout,local_28);
  std::__cxx11::string::~string(local_28);
  std::operator<<((ostream *)&std::cout,'\n');
  return;
}

Assistant:

void print_float_bits(float f) {
    cout << float_bit_string(f);

    std::cout << '\n';
  }